

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_B_cond_thumb(DisasContext_conflict1 *s,arg_ci *a)

{
  uint32_t cond;
  
  cond = a->cond;
  if ((int)cond < 0xe) {
    if (s->condexec_mask == 0) {
      arm_skip_unless(s,cond);
      if (((s->base).singlestep_enabled == false) && (s->ss_active != true)) {
        gen_goto_tb(s,0,(ulong)(a->imm + (uint)(s->thumb == 0) * 4 + (int)s->pc_curr + 4));
      }
      else {
        trans_B_cond_thumb_cold_1();
      }
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return (int)cond < 0xe;
}

Assistant:

static bool trans_B_cond_thumb(DisasContext *s, arg_ci *a)
{
    /* This has cond from encoding, required to be outside IT block.  */
    if (a->cond >= 0xe) {
        return false;
    }
    if (s->condexec_mask) {
        unallocated_encoding(s);
        return true;
    }
    arm_skip_unless(s, a->cond);
    gen_jmp(s, read_pc(s) + a->imm);
    return true;
}